

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall pbrt::ProjectiveCamera::InitMetadata(ProjectiveCamera *this,ImageMetadata *metadata)

{
  SquareMatrix<4> *m;
  Transform *__return_storage_ptr__;
  Vector3f delta;
  Transform NDCFromWorld;
  Transform local_330;
  Transform local_2b0;
  Transform local_230;
  Transform local_1b0;
  Transform local_130;
  Transform local_b0;
  
  __return_storage_ptr__ = &local_330;
  CameraTransform::CameraFromWorld
            (__return_storage_ptr__,(CameraTransform *)this,(this->super_CameraBase).shutterOpen);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator=
            (&metadata->cameraFromWorld,&__return_storage_ptr__->m);
  delta.super_Tuple3<pbrt::Vector3,_float>.z = 0.5;
  delta.super_Tuple3<pbrt::Vector3,_float>.x = 0.5;
  delta.super_Tuple3<pbrt::Vector3,_float>.y = 0.5;
  Translate(&local_1b0,(pbrt *)__return_storage_ptr__,delta);
  Scale(&local_230,0.5,0.5,0.5);
  Transform::operator*(&local_130,&local_1b0,&local_230);
  Transform::operator*(&local_b0,&local_130,&this->screenFromCamera);
  m = pstd::optional<pbrt::SquareMatrix<4>_>::value(&metadata->cameraFromWorld);
  Transform::Transform(&local_2b0,m);
  Transform::operator*(&local_330,&local_b0,&local_2b0);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator=(&metadata->NDCFromWorld,&local_330.m);
  CameraBase::InitMetadata(&this->super_CameraBase,metadata);
  return;
}

Assistant:

void ProjectiveCamera::InitMetadata(ImageMetadata *metadata) const {
    metadata->cameraFromWorld = cameraTransform.CameraFromWorld(shutterOpen).GetMatrix();

    // TODO: double check this
    Transform NDCFromWorld = Translate(Vector3f(0.5, 0.5, 0.5)) * Scale(0.5, 0.5, 0.5) *
                             screenFromCamera * *metadata->cameraFromWorld;
    metadata->NDCFromWorld = NDCFromWorld.GetMatrix();

    CameraBase::InitMetadata(metadata);
}